

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# INetwork.cpp
# Opt level: O0

void __thiscall
INetwork::Forward(INetwork *this,Sample *sample,vector<float,_std::allocator<float>_> *output,
                 Time time)

{
  size_type sVar1;
  reference ppIVar2;
  reference pvVar3;
  undefined8 in_RCX;
  undefined8 extraout_RDX;
  value_type extraout_XMM0_Da;
  int local_28;
  int neuronId;
  Time time_local;
  vector<float,_std::allocator<float>_> *output_local;
  Sample *sample_local;
  INetwork *this_local;
  
  (**(code **)(*(long *)this->eventManager + 0x18))(this->eventManager,sample,&this->input);
  (**(code **)(*(long *)this->eventManager + 0x10))
            (time,this->eventManager,this->useSTDP & 1,extraout_RDX,
             CONCAT71((int7)((ulong)in_RCX >> 8),this->useSTDP) & 0xffffffffffffff01);
  sVar1 = std::vector<INeuron_*,_std::allocator<INeuron_*>_>::size(&this->output);
  std::vector<float,_std::allocator<float>_>::resize(output,sVar1);
  local_28 = 0;
  while( true ) {
    sVar1 = std::vector<float,_std::allocator<float>_>::size(output);
    if (sVar1 <= (ulong)(long)local_28) break;
    ppIVar2 = std::vector<INeuron_*,_std::allocator<INeuron_*>_>::operator[]
                        (&this->output,(long)local_28);
    (*(*ppIVar2)->_vptr_INeuron[4])();
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](output,(long)local_28);
    *pvVar3 = extraout_XMM0_Da;
    local_28 = local_28 + 1;
  }
  (*this->_vptr_INetwork[6])();
  return;
}

Assistant:

void INetwork::Forward( const SPIKING_NN::Sample &sample, std::vector<float> &output, SPIKING_NN::Time time )
{
    eventManager->RegisterSample( sample, input );
    eventManager->RunSimulation( time, useSTDP );
    output.resize( this->output.size());
    for ( int neuronId = 0; neuronId < output.size(); ++neuronId ) {
        output[neuronId] = this->output[neuronId]->GetOutput();
    }
    Reset();
}